

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  pointer piVar2;
  bool bVar3;
  int iVar4;
  int i;
  uint index;
  char *in_R9;
  AssertionResult gtest_ar__5;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  AssertionResult gtest_ar_;
  TypeParam ht3;
  hasher hasher;
  TypeParam ht1;
  TypeParam ht2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_230;
  AssertHelper local_228;
  undefined8 *local_220;
  AssertHelper local_218;
  allocator_type local_210;
  pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_200;
  undefined1 local_1d8 [8];
  int *local_1d0;
  char local_1c8 [104];
  pointer local_160;
  Hasher local_14c;
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_140;
  undefined1 local_b8 [8];
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_b0;
  
  local_1d8 = (undefined1  [8])0x0;
  local_1d0 = (int *)((ulong)local_1d0 & 0xffffffff00000000);
  local_200.first.super_iterator.ht =
       (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_200.first.super_iterator.pos =
       (pointer)((ulong)local_200.first.super_iterator.pos & 0xffffffff00000000);
  local_b8 = (undefined1  [8])((ulong)local_b8 & 0xffffffff00000000);
  local_b0.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  super_TransparentHasher.super_Hasher._0_8_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (&local_140,0,(hasher *)local_1d8,(key_equal *)&local_200,(allocator_type *)local_b8);
  local_200.first.super_iterator.ht =
       (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_200.first.super_iterator.pos =
       (pointer)((ulong)local_200.first.super_iterator.pos & 0xffffffff00000000);
  local_210._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_210.count_ = (int *)((ulong)local_210.count_._4_4_ << 0x20);
  local_1d8 = (undefined1  [8])((ulong)local_1d8 & 0xffffffff00000000);
  local_1d0 = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_b8,0,(hasher *)&local_200,(key_equal *)&local_210,(allocator_type *)local_1d8)
  ;
  this_00 = &local_140.
             super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_200.first.super_iterator.ht =
       (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_200.first.super_iterator.ht._1_7_,bVar3);
  local_200.first.super_iterator.pos = (pointer)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)&local_200,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42e,(char *)local_1d8);
    testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_210._0_8_ + 8))();
    }
  }
  piVar2 = local_200.first.super_iterator.pos;
  if (local_200.first.super_iterator.pos != (pointer)0x0) {
    if (*(pointer *)local_200.first.super_iterator.pos != local_200.first.super_iterator.pos + 4) {
      operator_delete(*(pointer *)local_200.first.super_iterator.pos);
    }
    operator_delete(piVar2);
  }
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_200.first.super_iterator.ht =
       (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_200.first.super_iterator.ht._1_7_,bVar3);
  local_200.first.super_iterator.pos = (pointer)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)&local_200,(AssertionResult *)"ht1 != ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42f,(char *)local_1d8);
    testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_210._0_8_ + 8))();
    }
  }
  piVar2 = local_200.first.super_iterator.pos;
  if (local_200.first.super_iterator.pos != (pointer)0x0) {
    if (*(pointer *)local_200.first.super_iterator.pos != local_200.first.super_iterator.pos + 4) {
      operator_delete(*(pointer *)local_200.first.super_iterator.pos);
    }
    operator_delete(piVar2);
  }
  iVar4 = UniqueObjectHelper<int>(1);
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(this_00);
  local_140.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = -iVar4;
  local_140.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.use_deleted_ =
       true;
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_200.first.super_iterator.ht =
       (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_200.first.super_iterator.ht._1_7_,bVar3);
  local_200.first.super_iterator.pos = (pointer)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)&local_200,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x432,(char *)local_1d8);
    testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_210._0_8_ + 8))();
    }
  }
  piVar2 = local_200.first.super_iterator.pos;
  if (local_200.first.super_iterator.pos != (pointer)0x0) {
    if (*(pointer *)local_200.first.super_iterator.pos != local_200.first.super_iterator.pos + 4) {
      operator_delete(*(pointer *)local_200.first.super_iterator.pos);
    }
    operator_delete(piVar2);
  }
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_200.first.super_iterator.ht =
       (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_200.first.super_iterator.ht._1_7_,bVar3);
  local_200.first.super_iterator.pos = (pointer)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)&local_200,(AssertionResult *)"ht1 != ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x433,(char *)local_1d8);
    testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_210._0_8_ + 8))();
    }
  }
  piVar2 = local_200.first.super_iterator.pos;
  if (local_200.first.super_iterator.pos != (pointer)0x0) {
    if (*(pointer *)local_200.first.super_iterator.pos != local_200.first.super_iterator.pos + 4) {
      operator_delete(*(pointer *)local_200.first.super_iterator.pos);
    }
    operator_delete(piVar2);
  }
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize(this_00,2000);
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_200.first.super_iterator.ht =
       (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_200.first.super_iterator.ht._1_7_,bVar3);
  local_200.first.super_iterator.pos = (pointer)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)&local_200,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x435,(char *)local_1d8);
    testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_210._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_210._0_8_ + 8))();
    }
  }
  piVar2 = local_200.first.super_iterator.pos;
  if (local_200.first.super_iterator.pos != (pointer)0x0) {
    if (*(pointer *)local_200.first.super_iterator.pos != local_200.first.super_iterator.pos + 4) {
      operator_delete(*(pointer *)local_200.first.super_iterator.pos);
    }
    operator_delete(piVar2);
  }
  local_14c.id_ = 1;
  local_14c.num_hashes_ = 0;
  local_14c.num_compares_ = 0;
  local_210.id_ = 2;
  local_210.count_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_1d8,5,(hasher *)&local_14c,(key_equal *)&local_14c,&local_210);
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,(dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                *)&local_1d0);
  local_228.data_._0_4_ = CONCAT31(local_228.data_._1_3_,bVar3);
  local_220 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_200,(internal *)&local_228,(AssertionResult *)"ht1 == ht3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43b,(char *)local_200.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if (local_200.first.super_iterator.ht !=
        (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_200.first.super_iterator + 0x10U)) {
      operator_delete(local_200.first.super_iterator.ht);
    }
    if (local_230._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_230._M_head_impl + 8))();
    }
  }
  puVar1 = local_220;
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(puVar1);
  }
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,(dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                *)&local_1d0);
  local_228.data_._0_4_ = CONCAT31(local_228.data_._1_3_,bVar3);
  local_220 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_200,(internal *)&local_228,(AssertionResult *)"ht1 != ht3","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43c,(char *)local_200.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if (local_200.first.super_iterator.ht !=
        (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_200.first.super_iterator + 0x10U)) {
      operator_delete(local_200.first.super_iterator.ht);
    }
    if (local_230._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_230._M_head_impl + 8))();
    }
  }
  puVar1 = local_220;
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(puVar1);
  }
  local_228.data_._0_4_ = UniqueObjectHelper<int>(2);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&local_200,
           &local_140.
            super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&local_228);
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_228.data_._0_4_ = CONCAT31(local_228.data_._1_3_,!bVar3);
  local_220 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_200,(internal *)&local_228,(AssertionResult *)"ht1 != ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43f,(char *)local_200.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if (local_200.first.super_iterator.ht !=
        (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_200.first.super_iterator + 0x10U)) {
      operator_delete(local_200.first.super_iterator.ht);
    }
    if (local_230._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_230._M_head_impl + 8))();
    }
  }
  puVar1 = local_220;
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(puVar1);
  }
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_228.data_._0_4_ = CONCAT31(local_228.data_._1_3_,!bVar3);
  local_220 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_200,(internal *)&local_228,(AssertionResult *)"ht1 == ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x440,(char *)local_200.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if (local_200.first.super_iterator.ht !=
        (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_200.first.super_iterator + 0x10U)) {
      operator_delete(local_200.first.super_iterator.ht);
    }
    if (local_230._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_230._M_head_impl + 8))();
    }
  }
  puVar1 = local_220;
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(puVar1);
  }
  local_228.data_._0_4_ = UniqueObjectHelper<int>(2);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&local_200,
           (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)local_b8,(value_type *)&local_228);
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_228.data_._0_4_ = CONCAT31(local_228.data_._1_3_,bVar3);
  local_220 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_200,(internal *)&local_228,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x443,(char *)local_200.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if (local_200.first.super_iterator.ht !=
        (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_200.first.super_iterator + 0x10U)) {
      operator_delete(local_200.first.super_iterator.ht);
    }
    if (local_230._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_230._M_head_impl + 8))();
    }
  }
  puVar1 = local_220;
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(puVar1);
  }
  iVar4 = 3;
  do {
    local_228.data_._0_4_ = UniqueObjectHelper<int>(iVar4);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_200,
             &local_140.
              super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ,(value_type *)&local_228);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x7d1);
  index = 0x7d1;
  do {
    index = index - 1;
    local_228.data_._0_4_ = UniqueObjectHelper<int>(index);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_200,
             (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_b8,(value_type *)&local_228);
  } while (3 < index);
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_228.data_._0_4_ = CONCAT31(local_228.data_._1_3_,bVar3);
  local_220 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_200,(internal *)&local_228,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,1099,(char *)local_200.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if (local_200.first.super_iterator.ht !=
        (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_200.first.super_iterator + 0x10U)) {
      operator_delete(local_200.first.super_iterator.ht);
    }
    if (local_230._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_230._M_head_impl + 8))();
    }
  }
  puVar1 = local_220;
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(puVar1);
  }
  local_1d8 = (undefined1  [8])&PTR__BaseHashtableInterface_00c24568;
  if (local_160 != (pointer)0x0) {
    free(local_160);
  }
  local_b8 = (undefined1  [8])&PTR__BaseHashtableInterface_00c24568;
  if (local_b0.table != (pointer)0x0) {
    free(local_b0.table);
  }
  local_140.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c24568;
  if (local_140.
      super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.table != (pointer)0x0) {
    free(local_140.
         super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}